

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartThreadIM483Ix(IM483I *pIM483I)

{
  int iVar1;
  int local_1c;
  int id;
  IM483I *pIM483I_local;
  
  local_1c = 0;
  do {
    if ((IM483I *)addrsIM483I[local_1c] == pIM483I) {
      resIM483I[local_1c] = 1;
      bExitIM483I[local_1c] = 0;
      InitCriticalSection(IM483ICS + local_1c);
      iVar1 = CreateDefaultThread(IM483IThread,pIM483I,IM483IThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadIM483Ix(IM483I* pIM483I)
{
	int id = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resIM483I[id] = EXIT_FAILURE;
	bExitIM483I[id] = FALSE;
	InitCriticalSection(&IM483ICS[id]);
	return CreateDefaultThread(IM483IThread, (void*)pIM483I, &IM483IThreadId[id]);
}